

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::UdpInputPortDeclSyntax::setChild
          (UdpInputPortDeclSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  SyntaxNode *pSVar2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar3;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *pSVar4;
  logic_error *this_00;
  Token TVar5;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index == 2) {
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar4 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>>
                       (pSVar2);
    (this->names).super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar4->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->names).super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar4->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->names).super_SyntaxListBase.childCount = (pSVar4->super_SyntaxListBase).childCount;
    sVar1 = (pSVar4->elements).size_;
    (this->names).elements.data_ = (pSVar4->elements).data_;
    (this->names).elements.size_ = sVar1;
  }
  else if (index == 1) {
    TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->keyword).kind = TVar5.kind;
    (this->keyword).field_0x2 = TVar5._2_1_;
    (this->keyword).numFlags = (NumericTokenFlags)TVar5.numFlags.raw;
    (this->keyword).rawLen = TVar5.rawLen;
    (this->keyword).info = TVar5.info;
  }
  else {
    if (index != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
                 ,&local_d9);
      std::operator+(&local_98,&local_b8,":");
      std::__cxx11::to_string(&local_d8,0x3417);
      std::operator+(&local_78,&local_98,&local_d8);
      std::operator+(&local_58,&local_78,": ");
      std::operator+(&local_38,&local_58,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_38);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pSVar2 = TokenOrSyntax::node(&child);
    pSVar3 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (pSVar2);
    (this->super_UdpPortDeclSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar3->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->super_UdpPortDeclSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar3->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->super_UdpPortDeclSyntax).attributes.super_SyntaxListBase.childCount =
         (pSVar3->super_SyntaxListBase).childCount;
    sVar1 = (pSVar3->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
            size_;
    (this->super_UdpPortDeclSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
         (pSVar3->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
         data_;
    (this->super_UdpPortDeclSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  }
  return;
}

Assistant:

void UdpInputPortDeclSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: names = child.node()->as<SeparatedSyntaxList<IdentifierNameSyntax>>(); return;
        default: ASSUME_UNREACHABLE;
    }
}